

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dayperiodrules.cpp
# Opt level: O0

void icu_63::DayPeriodRules::load(UErrorCode *errorCode)

{
  UBool UVar1;
  DayPeriodRulesData *this;
  UHashtable *pUVar2;
  UResourceBundle *pUVar3;
  size_t in_RSI;
  DayPeriodRulesData *local_c0;
  undefined1 local_b8 [8];
  DayPeriodRulesDataSink sink;
  DayPeriodRulesCountSink countSink;
  LocalUResourceBundlePointer rb_dayPeriods;
  UErrorCode *errorCode_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    this = (DayPeriodRulesData *)UMemory::operator_new((UMemory *)0x18,in_RSI);
    local_c0 = (DayPeriodRulesData *)0x0;
    if (this != (DayPeriodRulesData *)0x0) {
      anon_unknown_0::DayPeriodRulesData::DayPeriodRulesData(this);
      local_c0 = this;
    }
    (anonymous_namespace)::data = local_c0;
    pUVar2 = uhash_open_63(uhash_hashChars_63,uhash_compareChars_63,(undefined1 *)0x0,errorCode);
    (anonymous_namespace)::data->localeToRuleSetNumMap = pUVar2;
    pUVar3 = ures_openDirect_63((char *)0x0,"dayPeriods",errorCode);
    LocalUResourceBundlePointer::LocalUResourceBundlePointer
              ((LocalUResourceBundlePointer *)&countSink,pUVar3);
    DayPeriodRulesCountSink::DayPeriodRulesCountSink((DayPeriodRulesCountSink *)&sink.period);
    pUVar3 = LocalPointerBase<UResourceBundle>::getAlias
                       ((LocalPointerBase<UResourceBundle> *)&countSink);
    ures_getAllItemsWithFallback_63(pUVar3,"rules",(ResourceSink *)&sink.period,errorCode);
    DayPeriodRulesDataSink::DayPeriodRulesDataSink((DayPeriodRulesDataSink *)local_b8);
    pUVar3 = LocalPointerBase<UResourceBundle>::getAlias
                       ((LocalPointerBase<UResourceBundle> *)&countSink);
    ures_getAllItemsWithFallback_63(pUVar3,"",(ResourceSink *)local_b8,errorCode);
    ucln_i18n_registerCleanup_63(UCLN_I18N_DAYPERIODRULES,dayPeriodRulesCleanup_63);
    DayPeriodRulesDataSink::~DayPeriodRulesDataSink((DayPeriodRulesDataSink *)local_b8);
    DayPeriodRulesCountSink::~DayPeriodRulesCountSink((DayPeriodRulesCountSink *)&sink.period);
    LocalUResourceBundlePointer::~LocalUResourceBundlePointer
              ((LocalUResourceBundlePointer *)&countSink);
  }
  return;
}

Assistant:

void U_CALLCONV DayPeriodRules::load(UErrorCode &errorCode) {
    if (U_FAILURE(errorCode)) {
        return;
    }

    data = new DayPeriodRulesData();
    data->localeToRuleSetNumMap = uhash_open(uhash_hashChars, uhash_compareChars, NULL, &errorCode);
    LocalUResourceBundlePointer rb_dayPeriods(ures_openDirect(NULL, "dayPeriods", &errorCode));

    // Get the largest rule set number (so we allocate enough objects).
    DayPeriodRulesCountSink countSink;
    ures_getAllItemsWithFallback(rb_dayPeriods.getAlias(), "rules", countSink, errorCode);

    // Populate rules.
    DayPeriodRulesDataSink sink;
    ures_getAllItemsWithFallback(rb_dayPeriods.getAlias(), "", sink, errorCode);

    ucln_i18n_registerCleanup(UCLN_I18N_DAYPERIODRULES, dayPeriodRulesCleanup);
}